

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testValidScale(void)

{
  RepeatedField<long> *this;
  RepeatedField<unsigned_long> *pRVar1;
  RepeatedField<float> *pRVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  long *plVar8;
  FeatureDescription *pFVar9;
  ArrayFeatureType *pAVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  LayerUnion LVar14;
  unsigned_long *puVar15;
  WeightParams *pWVar16;
  float *pfVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar20;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  Arena *pAVar21;
  int iVar22;
  Model m1;
  Result res;
  Model local_80;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_80,(Arena *)0x0,false);
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_00179fc7:
    pRVar20 = &(local_80.description_)->input_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar22 = ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_00179fc7;
    ((local_80.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar13 = pRVar4->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar19);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar10 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  this = &pAVar10->shape_;
  uVar3 = (pAVar10->shape_).current_size_;
  if (uVar3 == (pAVar10->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(this);
    plVar8[uVar3] = 1;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(this);
    plVar8[uVar3] = 1;
  }
  this->current_size_ = uVar3 + 1;
  if (local_80.description_ == (ModelDescription *)0x0) {
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar21);
  }
  pRVar4 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0017a0f2:
    pRVar20 = &(local_80.description_)->output_;
    pFVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                       ((pRVar20->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar20->super_RepeatedPtrFieldBase,pFVar9);
  }
  else {
    iVar22 = ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_0017a0f2;
    ((local_80.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar13 = pRVar4->elements[iVar22];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"probs",puVar19);
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar21 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar21);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    pAVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                        (pAVar21);
    (pFVar7->Type_).multiarraytype_ = pAVar10;
  }
  if (local_80._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_80);
    local_80._oneof_case_[0] = 500;
    pAVar21 = (Arena *)(local_80.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_80.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    local_80.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar21);
  }
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_80.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0017a1ec:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_80.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar22 = (local_80.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_0017a1ec;
    (local_80.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar22 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar22];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_0017a225:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar22 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar22) goto LAB_0017a225;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
    pvVar13 = pRVar4->elements[iVar22];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3a8ef3);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar22 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar22 < pRVar4->allocated_size) {
      (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar22 + 1;
      pvVar13 = pRVar4->elements[iVar22];
      goto LAB_0017a290;
    }
  }
  pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
LAB_0017a290:
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3977ad);
  if (pNVar11->_oneof_case_[0] == 0xf5) {
    LVar14 = pNVar11->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0xf5;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar21 = *(Arena **)pAVar21;
    }
    LVar14.scale_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ScaleLayerParams>
                   (pAVar21);
    (pNVar11->layer_).scale_ = (ScaleLayerParams *)LVar14;
  }
  pRVar1 = &(LVar14.convolution_)->kernelsize_;
  uVar3 = ((LVar14.convolution_)->kernelsize_).current_size_;
  if (uVar3 == ((LVar14.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,uVar3 + 1);
    puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(pRVar1);
    puVar15[uVar3] = 5;
  }
  else {
    puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(pRVar1);
    puVar15[uVar3] = 5;
  }
  ((LVar14.convolution_)->kernelsize_).current_size_ = uVar3 + 1;
  iVar22 = 5;
  do {
    pWVar16 = (LVar14.scale_)->scale_;
    if (pWVar16 == (WeightParams *)0x0) {
      uVar5 = ((LVar14.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar21 = *(Arena **)pAVar21;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar21);
      (LVar14.scale_)->scale_ = pWVar16;
    }
    pRVar2 = &pWVar16->floatvalue_;
    uVar3 = (pWVar16->floatvalue_).current_size_;
    if (uVar3 == (pWVar16->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
      pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar17[uVar3] = 1.0;
    }
    else {
      pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar17[uVar3] = 1.0;
    }
    pRVar2->current_size_ = uVar3 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  pRVar1 = &(LVar14.convolution_)->stride_;
  uVar3 = ((LVar14.convolution_)->stride_).current_size_;
  if (uVar3 == ((LVar14.convolution_)->stride_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(pRVar1,uVar3 + 1);
    puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(pRVar1);
    puVar15[uVar3] = 3;
  }
  else {
    puVar15 = google::protobuf::RepeatedField<unsigned_long>::elements(pRVar1);
    puVar15[uVar3] = 3;
  }
  ((LVar14.convolution_)->stride_).current_size_ = uVar3 + 1;
  (LVar14.scale_)->hasbias_ = true;
  iVar22 = 3;
  do {
    pWVar16 = (LVar14.scale_)->bias_;
    if (pWVar16 == (WeightParams *)0x0) {
      uVar5 = ((LVar14.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar21 = (Arena *)(uVar5 & 0xfffffffffffffffc);
      if ((uVar5 & 1) != 0) {
        pAVar21 = *(Arena **)pAVar21;
      }
      pWVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar21);
      (LVar14.scale_)->bias_ = pWVar16;
    }
    pRVar2 = &pWVar16->floatvalue_;
    uVar3 = (pWVar16->floatvalue_).current_size_;
    if (uVar3 == (pWVar16->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
      pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar17[uVar3] = 1.0;
    }
    else {
      pfVar17 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar17[uVar3] = 1.0;
    }
    pRVar2->current_size_ = uVar3 + 1;
    iVar22 = iVar22 + -1;
  } while (iVar22 != 0);
  CoreML::validate<(MLModelType)500>(&local_50,&local_80);
  bVar6 = CoreML::Result::good(&local_50);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xd79);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
    std::ostream::put((char)poVar18);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_80);
  return (uint)!bVar6;
}

Assistant:

int testValidScale() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *scaleLayer = nn->add_layers();
    scaleLayer->add_input("input");
    scaleLayer->add_output("probs");
    auto *params = scaleLayer->mutable_scale();
    int num_channel = 5;
    params->add_shapescale(num_channel);

    for (int i = 0; i < num_channel; i++) {
        params->mutable_scale()->add_floatvalue(1.0);
    }

    int num_bias = 3;
    params->add_shapebias(num_bias);
    params->set_hasbias(true);
    for (int i = 0; i < num_bias; i++) {
        params->mutable_bias()->add_floatvalue(1.0);
    }

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    return 0;
}